

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

void ExpReplay::finish<COST_SENSITIVE::cs_label>(expreplay *er)

{
  example *in_RDI;
  _func_void_void_ptr *unaff_retaddr;
  size_t n;
  _func_void_void_ptr *delete_prediction;
  
  for (delete_prediction = (_func_void_void_ptr *)0x0;
      delete_prediction < (in_RDI->super_example_predict).indices._end;
      delete_prediction = delete_prediction + 1) {
    (*(code *)PTR_delete_label_0048cc78)
              ((in_RDI->super_example_predict).indices.end_array +
               (long)delete_prediction * 0x68d0 + 0x6828);
    VW::dealloc_example(unaff_retaddr,in_RDI,delete_prediction);
  }
  free((in_RDI->super_example_predict).indices.end_array);
  free((void *)(in_RDI->super_example_predict).indices.erase_count);
  return;
}

Assistant:

void finish(expreplay& er)
{
  for (size_t n = 0; n < er.N; n++)
  {
    lp.delete_label(&er.buf[n].l);
    VW::dealloc_example(NULL, er.buf[n], NULL);  // TODO: need to free label
  }
  free(er.buf);
  free(er.filled);
}